

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

char * fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>
                 (char *begin,char *end,format_handler<char> *handler)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  id_adapter adapter;
  id_adapter local_30;
  
  pcVar3 = begin + 1;
  if (pcVar3 == end) {
    report_error("invalid format string");
  }
  cVar1 = *pcVar3;
  if (cVar1 != ':') {
    if (cVar1 == '{') {
      format_handler<char>::on_text(handler,pcVar3,begin + 2);
      return begin + 2;
    }
    if (cVar1 == '}') {
      iVar2 = parse_context<char>::next_arg_id(&handler->parse_ctx);
      format_handler<char>::on_replacement_field(handler,iVar2,pcVar3);
      return begin + 2;
    }
    local_30.arg_id = 0;
    local_30.handler = handler;
    pcVar3 = parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>(char_const*,char_const*,fmt::v11::detail::format_handler<char>&)::id_adapter&>
                       (pcVar3,end,&local_30);
    if (pcVar3 != end) {
      iVar2 = local_30.arg_id;
      if (*pcVar3 == ':') goto LAB_001b8e2a;
      if (*pcVar3 == '}') {
        format_handler<char>::on_replacement_field(handler,local_30.arg_id,pcVar3);
        return pcVar3 + 1;
      }
    }
    report_error("missing \'}\' in format string");
  }
  iVar2 = parse_context<char>::next_arg_id(&handler->parse_ctx);
LAB_001b8e2a:
  pcVar3 = format_handler<char>::on_format_specs(handler,iVar2,pcVar3 + 1,end);
  if ((pcVar3 != end) && (*pcVar3 == '}')) {
    return pcVar3 + 1;
  }
  report_error("unknown format specifier");
}

Assistant:

FMT_CONSTEXPR FMT_INLINE auto parse_replacement_field(const Char* begin,
                                                      const Char* end,
                                                      Handler&& handler)
    -> const Char* {
  ++begin;
  if (begin == end) {
    handler.on_error("invalid format string");
    return end;
  }
  int arg_id = 0;
  switch (*begin) {
  case '}':
    handler.on_replacement_field(handler.on_arg_id(), begin);
    return begin + 1;
  case '{': handler.on_text(begin, begin + 1); return begin + 1;
  case ':': arg_id = handler.on_arg_id(); break;
  default:  {
    struct id_adapter {
      Handler& handler;
      int arg_id;

      FMT_CONSTEXPR void on_index(int id) { arg_id = handler.on_arg_id(id); }
      FMT_CONSTEXPR void on_name(basic_string_view<Char> id) {
        arg_id = handler.on_arg_id(id);
      }
    } adapter = {handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    arg_id = adapter.arg_id;
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(arg_id, begin);
      return begin + 1;
    }
    if (c != ':') {
      handler.on_error("missing '}' in format string");
      return end;
    }
    break;
  }
  }
  begin = handler.on_format_specs(arg_id, begin + 1, end);
  if (begin == end || *begin != '}')
    return handler.on_error("unknown format specifier"), end;
  return begin + 1;
}